

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocator_T::BindBufferMemory
          (VmaAllocator_T *this,VmaAllocation hAllocation,VkDeviceSize allocationLocalOffset,
          VkBuffer hBuffer,void *pNext)

{
  ALLOCATION_TYPE AVar1;
  VkBuffer in_RCX;
  void *in_RDX;
  VmaAllocation_T *in_RSI;
  VmaAllocator in_RDI;
  void *in_R8;
  VmaDeviceMemoryBlock *unaff_retaddr;
  VmaAllocator_T *in_stack_00000008;
  VmaDeviceMemoryBlock *pBlock;
  VkResult res;
  VmaAllocation_T *in_stack_ffffffffffffffc8;
  VkResult local_2c;
  
  local_2c = VK_SUCCESS;
  AVar1 = VmaAllocation_T::GetType(in_RSI);
  if (AVar1 == ALLOCATION_TYPE_BLOCK) {
    VmaAllocation_T::GetBlock(in_RSI);
    local_2c = VmaDeviceMemoryBlock::BindBufferMemory
                         (unaff_retaddr,in_RDI,in_RSI,(VkDeviceSize)in_RDX,in_RCX,in_R8);
  }
  else if (AVar1 == ALLOCATION_TYPE_DEDICATED) {
    VmaAllocation_T::GetMemory(in_stack_ffffffffffffffc8);
    local_2c = BindVulkanBuffer(in_stack_00000008,(VkDeviceMemory)unaff_retaddr,(VkDeviceSize)in_RDI
                                ,(VkBuffer)in_RSI,in_RDX);
  }
  return local_2c;
}

Assistant:

VkResult VmaAllocator_T::BindBufferMemory(
    VmaAllocation hAllocation,
    VkDeviceSize allocationLocalOffset,
    VkBuffer hBuffer,
    const void* pNext)
{
    VkResult res = VK_SUCCESS;
    switch(hAllocation->GetType())
    {
    case VmaAllocation_T::ALLOCATION_TYPE_DEDICATED:
        res = BindVulkanBuffer(hAllocation->GetMemory(), allocationLocalOffset, hBuffer, pNext);
        break;
    case VmaAllocation_T::ALLOCATION_TYPE_BLOCK:
    {
        VmaDeviceMemoryBlock* const pBlock = hAllocation->GetBlock();
        VMA_ASSERT(pBlock && "Binding buffer to allocation that doesn't belong to any block.");
        res = pBlock->BindBufferMemory(this, hAllocation, allocationLocalOffset, hBuffer, pNext);
        break;
    }
    default:
        VMA_ASSERT(0);
    }
    return res;
}